

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O3

void pack_dict(lua_State *L,bson *b,_Bool isarray)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint8_t *puVar4;
  lua_Integer lVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  size_t sz;
  char numberkey [32];
  size_t local_68;
  size_t local_60;
  char local_58 [10] [4];
  
  local_60 = (size_t)b->size;
  iVar8 = b->size + 4;
  iVar1 = b->cap;
  if (iVar1 < iVar8) {
    do {
      iVar1 = iVar1 * 2;
    } while (iVar1 <= iVar8);
    b->cap = iVar1;
    if (b->ptr == b->buffer) {
      puVar4 = (uint8_t *)malloc((long)iVar1);
      b->ptr = puVar4;
      memcpy(puVar4,b->buffer,local_60);
    }
    else {
      puVar4 = (uint8_t *)realloc(b->ptr,(long)iVar1);
      b->ptr = puVar4;
      iVar8 = b->size + 4;
    }
  }
  b->size = iVar8;
  lua_pushnil(L);
  iVar1 = lua_next(L,-2);
  if (iVar1 != 0) {
    do {
      iVar1 = lua_type(L,-2);
      if (isarray) {
        if (iVar1 != 3) {
          pcVar7 = "Invalid array key type : %s";
LAB_0011a748:
          pcVar6 = lua_typename(L,iVar1);
          luaL_error(L,pcVar7,pcVar6);
        }
        lVar5 = lua_tointegerx(L,-2,(int *)0x0);
        uVar2 = (int)lVar5 - 1;
        if (uVar2 < 0x400) {
          local_58[0] = bson_numstrs[uVar2];
          iVar1 = bson_numstr_len[uVar2];
        }
        else {
          iVar1 = sprintf(local_58[0],"%u",(ulong)uVar2);
        }
        local_68 = (size_t)iVar1;
        append_one(b,L,local_58[0],local_68);
        iVar1 = -2;
      }
      else if (iVar1 == 4) {
        iVar1 = -2;
        pcVar7 = lua_tolstring(L,-2,&local_68);
        append_one(b,L,pcVar7,local_68);
      }
      else {
        if (iVar1 != 3) {
          pcVar7 = "Invalid key type : %s";
          goto LAB_0011a748;
        }
        lua_pushvalue(L,-2);
        lua_rotate(L,-2,1);
        pcVar7 = lua_tolstring(L,-2,&local_68);
        append_one(b,L,pcVar7,local_68);
        iVar1 = -3;
      }
      lua_settop(L,iVar1);
      iVar1 = lua_next(L,-2);
    } while (iVar1 != 0);
  }
  iVar8 = b->size;
  iVar3 = b->cap;
  iVar1 = iVar8 + 1;
  if (iVar8 < iVar3) {
    puVar4 = b->ptr;
  }
  else {
    do {
      iVar3 = iVar3 * 2;
    } while (iVar3 <= iVar1);
    b->cap = iVar3;
    if (b->ptr == b->buffer) {
      puVar4 = (uint8_t *)malloc((long)iVar3);
      b->ptr = puVar4;
      memcpy(puVar4,b->buffer,(long)iVar8);
    }
    else {
      puVar4 = (uint8_t *)realloc(b->ptr,(long)iVar3);
      b->ptr = puVar4;
      iVar8 = b->size;
      iVar1 = iVar8 + 1;
    }
  }
  b->size = iVar1;
  puVar4[iVar8] = '\0';
  iVar1 = b->size - (int)local_60;
  b->ptr[local_60] = (uint8_t)iVar1;
  b->ptr[local_60 + 1] = (uint8_t)((uint)iVar1 >> 8);
  b->ptr[local_60 + 2] = (uint8_t)((uint)iVar1 >> 0x10);
  b->ptr[local_60 + 3] = (uint8_t)((uint)iVar1 >> 0x18);
  return;
}

Assistant:

static void
pack_dict(lua_State *L, struct bson *b, bool isarray) {
	int length = reserve_length(b);
	lua_pushnil(L);
	while(lua_next(L,-2) != 0) {
		int kt = lua_type(L, -2);
		char numberkey[32];
		const char * key = NULL;
		size_t sz;
		if (isarray) {
			if (kt != LUA_TNUMBER) {
				luaL_error(L, "Invalid array key type : %s", lua_typename(L, kt));
				return;
			}
			sz = bson_numstr(numberkey, (unsigned int)lua_tointeger(L,-2)-1);
			key = numberkey;

			append_one(b, L, key, sz);
			lua_pop(L,1);
		} else {
			switch(kt) {
			case LUA_TNUMBER:
				// copy key, don't change key type
				lua_pushvalue(L,-2);
				lua_insert(L,-2);
				key = lua_tolstring(L,-2,&sz);
				append_one(b, L, key, sz);
				lua_pop(L,2);
				break;
			case LUA_TSTRING:
				key = lua_tolstring(L,-2,&sz);
				append_one(b, L, key, sz);
				lua_pop(L,1);
				break;
			default:
				luaL_error(L, "Invalid key type : %s", lua_typename(L, kt));
				return;
			}
		}
	}
	write_byte(b,0);
	write_length(b, b->size - length, length);
}